

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintFileDescriptor(Generator *this)

{
  Printer *pPVar1;
  mapped_type *pmVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  allocator<char> aaStack_c8 [32];
  char file_descriptor_template [89];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  
  bVar6 = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)file_descriptor_template,"descriptor_name",aaStack_c8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)file_descriptor_template);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)file_descriptor_template);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)file_descriptor_template,"name",aaStack_c8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)file_descriptor_template);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)file_descriptor_template);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)file_descriptor_template,"package",aaStack_c8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,(key_type *)file_descriptor_template);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)file_descriptor_template);
  pcVar4 = 
  "$descriptor_name$ = _descriptor.FileDescriptor(\n  name=\'$name$\',\n  package=\'$package$\',\n";
  pcVar5 = file_descriptor_template;
  for (lVar3 = 0x59; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pcVar5 = *pcVar4;
    pcVar4 = pcVar4 + (ulong)bVar6 * -2 + 1;
    pcVar5 = pcVar5 + (ulong)bVar6 * -2 + 1;
  }
  google::protobuf::io::Printer::Print((map *)this->printer_,(char *)&m);
  google::protobuf::io::Printer::Indent();
  pPVar1 = this->printer_;
  google::protobuf::strings::CHexEscape((string *)aaStack_c8);
  google::protobuf::io::Printer::Print
            ((char *)pPVar1,"serialized_pb=\'$value$\'",(string *)0x184c55);
  std::__cxx11::string::~string((string *)aaStack_c8);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)this->printer_);
  google::protobuf::io::Printer::Print((char *)this->printer_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  return;
}

Assistant:

void Generator::PrintFileDescriptor() const {
  map<string, string> m;
  m["descriptor_name"] = kDescriptorKey;
  m["name"] = file_->name();
  m["package"] = file_->package();
  const char file_descriptor_template[] =
      "$descriptor_name$ = _descriptor.FileDescriptor(\n"
      "  name='$name$',\n"
      "  package='$package$',\n";
  printer_->Print(m, file_descriptor_template);
  printer_->Indent();
  printer_->Print(
      "serialized_pb='$value$'",
      "value", strings::CHexEscape(file_descriptor_serialized_));

  // TODO(falk): Also print options and fix the message_type, enum_type,
  //             service and extension later in the generation.

  printer_->Outdent();
  printer_->Print(")\n");
  printer_->Print("\n");
}